

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Volume.hpp
# Opt level: O0

void __thiscall Volume::Volume(Volume *this)

{
  long in_RDI;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *this_00;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_ffffffffffffffd0;
  ObjCompFunctor *__x;
  priority_queue<unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_Volume::ObjCompFunctor>
  *this_01;
  ObjCompFunctor local_10 [2];
  
  ObjCompFunctor::ObjCompFunctor
            (local_10,(vector<Object,_std::allocator<Object>_> *)(in_RDI + 0x20));
  __x = (ObjCompFunctor *)0x0;
  this_01 = (priority_queue<unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_Volume::ObjCompFunctor>
             *)0x0;
  this_00 = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)&stack0xffffffffffffffd8;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x142e96);
  std::
  priority_queue<unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_Volume::ObjCompFunctor>
  ::priority_queue(this_01,__x,in_stack_ffffffffffffffd0);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector(this_00);
  std::vector<Object,_std::allocator<Object>_>::vector
            ((vector<Object,_std::allocator<Object>_> *)0x142ec4);
  return;
}

Assistant:

Volume(): heap(ObjCompFunctor(objs)) {}